

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O3

int __thiscall
CVmObjVector::getp_subset(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  CVmObjPageEntry *pCVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  vm_datatype_t *pvVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  vm_val_t *pvVar6;
  vm_val_t *pvVar7;
  int iVar8;
  vm_obj_id_t vVar9;
  ulong element_count;
  long lVar10;
  char *buf;
  uint16_t tmp;
  long lVar11;
  vm_val_t ele;
  vm_rcdesc rc;
  vm_val_t local_88;
  vm_rcdesc local_78;
  
  if (getp_subset(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_subset();
  }
  vm_rcdesc::init(&local_78,(EVP_PKEY_CTX *)"Vector.subset");
  iVar8 = CVmObject::get_prop_check_argc(retval,argc,&getp_subset::desc);
  pvVar6 = sp_;
  if (iVar8 == 0) {
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_OBJ;
    (pvVar6->val).obj = self;
    element_count = (ulong)*(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    lVar11 = 0;
    vVar9 = create(0,element_count);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar9;
    pvVar5 = sp_;
    pCVar1 = G_obj_table_X.pages_[vVar9 >> 0xc];
    uVar4 = *(undefined4 *)&retval->field_0x4;
    aVar2 = retval->val;
    sp_ = sp_ + 1;
    pvVar5->typ = retval->typ;
    *(undefined4 *)&pvVar5->field_0x4 = uVar4;
    pvVar5->val = aVar2;
    if (element_count != 0) {
      lVar10 = 0;
      lVar11 = 0;
      do {
        buf = (this->super_CVmObjCollection).super_CVmObject.ext_ + lVar10 + 4;
        local_88.typ = (vm_datatype_t)*buf;
        vmb_get_dh_val(buf,&local_88);
        pvVar5 = sp_;
        pvVar7 = sp_ + 1;
        *(ulong *)sp_ = CONCAT44(local_88._4_4_,local_88.typ);
        sp_ = pvVar7;
        pvVar5->val = local_88.val;
        CVmRun::call_func_ptr(&G_interpreter_X,pvVar6 + -1,1,&local_78,0);
        if ((r0_.typ != VM_NIL) && ((r0_.typ != VM_INT || (r0_.val.obj != 0)))) {
          vmb_put_dh((char *)(*(long *)((long)&pCVar1->ptr_ + (ulong)((vVar9 & 0xfff) * 0x18) + 8) +
                              lVar11 * 5 + 4),&local_88);
          lVar11 = lVar11 + 1;
        }
        lVar10 = lVar10 + 5;
      } while (element_count * 5 != lVar10);
    }
    *(short *)(*(long *)((long)&pCVar1->ptr_ + (ulong)((vVar9 & 0xfff) * 0x18) + 8) + 2) =
         (short)lVar11;
    sp_ = sp_ + -3;
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_subset(VMG_ vm_obj_id_t self, vm_val_t *retval,
                              uint *argc)
{
    const vm_val_t *func_val;
    size_t src;
    size_t dst;
    size_t cnt;
    CVmObjVector *new_vec;
    static CVmNativeCodeDesc desc(1);
    vm_rcdesc rc(vmg_ "Vector.subset", self, 5, G_stk->get(0), argc);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the function pointer argument, but leave it on the stack */
    func_val = G_stk->get(0);

    /* push a self-reference while allocating to protect from gc */
    G_interpreter->push_obj(vmg_ self);

    /* 
     *   allocate the new vector that we'll return - all we know at this
     *   point is that the new vector won't be larger than the current
     *   vector, so allocate at the current size 
     */
    cnt = get_element_count();
    retval->set_obj(create(vmg_ FALSE, cnt));

    /* get the return value as an vector */
    new_vec = (CVmObjVector *)vm_objp(vmg_ retval->val.obj);

    /* 
     *   push a reference to the new list to protect it from the garbage
     *   collector, which could be invoked in the course of executing the
     *   user callback 
     */
    G_stk->push(retval);

    /*
     *   Go through each element of our list, and invoke the callback on
     *   each element.  If the element passes, write it to the current
     *   output location in the list; otherwise, just skip it.
     *   
     *   Note that we're using the same list as source and destination,
     *   which is easy because the list will either shrink or stay the
     *   same - we'll never need to insert new elements.  
     */
    for (src = dst = 0 ; src < cnt ; ++src)
    {
        vm_val_t ele;
        const vm_val_t *val;

        /* get this element from the source vector */
        get_element(src, &ele);

        /* push the element as the callback's argument */
        G_stk->push(&ele);

        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ func_val, 1, &rc, 0);

        /* get the result from R0 */
        val = G_interpreter->get_r0();

        /* 
         *   if the callback returned non-nil and non-zero, include this
         *   element in the result 
         */
        if (val->typ == VM_NIL
            || (val->typ == VM_INT && val->val.intval == 0))
        {
            /* it's nil or zero - don't include it in the result */
        }
        else
        {
            /* 
             *   include this element in the result (there's no need to
             *   save undo, since the whole vector is new) 
             */
            new_vec->set_element(dst, &ele);

            /* advance the output index */
            ++dst;
        }
    }

    /* set the actual number of elements in the result */
    new_vec->set_element_count(dst);

    /* discard our gc protection (self, return value) and our arguments */
    G_stk->discard(3);

    /* handled */
    return TRUE;
}